

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckFuncTypeIndex(SharedValidator *this,Var *sig_var,FuncType *out)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  Result RVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  void *pvStack_90;
  undefined8 local_88;
  long lStack_80;
  undefined8 local_78;
  Var local_70;
  
  Var::Var(&local_70,sig_var);
  RVar3 = CheckIndex(this,&local_70,this->num_types_,"function type");
  Var::~Var(&local_70);
  if (RVar3.enum_ == Error) {
    local_88 = 0;
    lStack_80 = 0;
    pvStack_90 = (void *)0x0;
    local_78 = 0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign(&out->params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign(&out->results,&pvStack_90);
    out->type_index = (Index)local_78;
    if (pvStack_90 != (void *)0x0) {
      operator_delete(pvStack_90,lStack_80 - (long)pvStack_90);
    }
    RVar3.enum_ = Error;
  }
  else {
    if (sig_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    _Var2 = (sig_var->field_2).index_;
    p_Var1 = &(this->func_types_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->func_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
      bVar6 = p_Var5[1]._M_color < _Var2;
      if (!bVar6) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, _Var2 < p_Var4[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      RVar3 = PrintError(this,&sig_var->loc,"type %d is not a function");
    }
    else {
      RVar3.enum_ = Ok;
      if (out != (FuncType *)0x0) {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->params,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&p_Var5[1]._M_parent);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&out->results,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var5 + 2));
        out->type_index = *(Index *)&p_Var5[2]._M_right;
      }
    }
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckFuncTypeIndex(Var sig_var, FuncType* out) {
  Result result = CheckIndex(sig_var, num_types_, "function type");
  if (Failed(result)) {
    *out = FuncType{};
    return Result::Error;
  }

  auto iter = func_types_.find(sig_var.index());
  if (iter == func_types_.end()) {
    return PrintError(sig_var.loc, "type %d is not a function",
                      sig_var.index());
  }

  if (out) {
    *out = iter->second;
  }
  return Result::Ok;
}